

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

file_status __thiscall boost::filesystem::detail::status(detail *this,path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  error_category *peVar5;
  filesystem_error *this_00;
  uint uVar6;
  int errval;
  char *__file;
  error_code ec_00;
  allocator<char> local_d9;
  string local_d8;
  stat path_stat;
  
  __file = (p->m_pathname)._M_dataplus._M_p;
  iVar2 = stat64(__file,(stat64 *)&path_stat);
  errval = (int)__file;
  if (iVar2 == 0) {
    if (ec != (error_code *)0x0) {
      system::error_code::clear(ec);
    }
    uVar3 = 0xffff;
    uVar6 = 10;
    switch((path_stat.st_mode & 0xf000) - 0x1000 >> 0xc) {
    case 0:
      uVar6 = 7;
      break;
    case 1:
      uVar6 = 6;
      break;
    default:
      goto switchD_0010dbc7_caseD_2;
    case 3:
      uVar6 = 3;
      break;
    case 5:
      uVar6 = 5;
      break;
    case 7:
      uVar6 = 2;
      break;
    case 0xb:
      uVar6 = 8;
    }
    uVar3 = path_stat.st_mode & 0xfff;
  }
  else {
    puVar4 = (uint *)__errno_location();
    if (ec != (error_code *)0x0) {
      uVar6 = *puVar4;
      peVar5 = system::system_category();
      ec->m_val = uVar6;
      ec->m_cat = peVar5;
    }
    bVar1 = anon_unknown.dwarf_54f5::not_found_error(errval);
    uVar3 = 0xffff;
    if (bVar1) {
      uVar3 = 0;
    }
    if (ec == (error_code *)0x0 && !bVar1) {
      this_00 = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"boost::filesystem::status",&local_d9);
      uVar6 = *puVar4;
      peVar5 = system::system_category();
      ec_00._4_4_ = 0;
      ec_00.m_val = uVar6;
      ec_00.m_cat = peVar5;
      filesystem_error::filesystem_error(this_00,&local_d8,p,ec_00);
      __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    uVar6 = (uint)bVar1;
  }
switchD_0010dbc7_caseD_2:
  *(uint *)this = uVar6;
  *(uint *)(this + 4) = uVar3;
  return (file_status)this;
}

Assistant:

BOOST_FILESYSTEM_DECL
  file_status status(const path& p, error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (::stat(p.c_str(), &path_stat)!= 0)
    {
      if (ec != 0)                            // always report errno, even though some
        ec->assign(errno, system_category());   // errno values are not status_errors

      if (not_found_error(errno))
      {
        return fs::file_status(fs::file_not_found, fs::no_perms);
      }
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error("boost::filesystem::status",
          p, error_code(errno, system_category())));
      return fs::file_status(fs::status_error);
    }
    if (ec != 0) ec->clear();;
    if (S_ISDIR(path_stat.st_mode))
      return fs::file_status(fs::directory_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISREG(path_stat.st_mode))
      return fs::file_status(fs::regular_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISBLK(path_stat.st_mode))
      return fs::file_status(fs::block_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISCHR(path_stat.st_mode))
      return fs::file_status(fs::character_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISFIFO(path_stat.st_mode))
      return fs::file_status(fs::fifo_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISSOCK(path_stat.st_mode))
      return fs::file_status(fs::socket_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    return fs::file_status(fs::type_unknown);

#   else  // Windows

    DWORD attr(::GetFileAttributesW(p.c_str()));
    if (attr == 0xFFFFFFFF)
    {
      return process_status_failure(p, ec);
    }

    //  reparse point handling;
    //    since GetFileAttributesW does not resolve symlinks, try to open a file
    //    handle to discover if the file exists
    if (attr & FILE_ATTRIBUTE_REPARSE_POINT)
    {
      handle_wrapper h(
        create_file_handle(
            p.c_str(),
            0,  // dwDesiredAccess; attributes only
            FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE,
            0,  // lpSecurityAttributes
            OPEN_EXISTING,
            FILE_FLAG_BACKUP_SEMANTICS,
            0)); // hTemplateFile
      if (h.handle == INVALID_HANDLE_VALUE)
      {
        return process_status_failure(p, ec);
      }

      if (!is_reparse_point_a_symlink(p))
        return file_status(reparse_file, make_permissions(p, attr));
    }

    if (ec != 0) ec->clear();
    return (attr & FILE_ATTRIBUTE_DIRECTORY)
      ? file_status(directory_file, make_permissions(p, attr))
      : file_status(regular_file, make_permissions(p, attr));

#   endif
  }